

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O2

dropt_char ** dropt_parse(dropt_context *context,int argc,dropt_char **argv)

{
  char *pcVar1;
  size_t sVar2;
  size_t numElements;
  char *__s;
  _Bool _Var3;
  int iVar4;
  dropt_error dVar5;
  option_proxy *poVar6;
  char *pcVar7;
  undefined8 *puVar8;
  dropt_context **ppdVar9;
  char shortName;
  dropt_char **ppdVar10;
  size_t sVar11;
  dropt_option *pdVar12;
  dropt_option *pdVar13;
  size_t sVar14;
  dropt_char *pdVar15;
  size_t sVar16;
  bool bVar17;
  char_array optionName;
  parse_state local_78;
  char *local_50;
  long local_48;
  dropt_option *local_40;
  dropt_context *local_38;
  
  local_78.option = (dropt_option *)0x0;
  local_78.optionArgument = (char *)0x0;
  local_78.argNext = argv;
  if (argv != (dropt_char **)0x0) {
    if (context == (dropt_context *)0x0) {
      dropt_misuse("No dropt context specified.",
                   "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                   ,0x530);
    }
    if (argc == -1) {
      argc = -1;
      ppdVar10 = argv;
      do {
        argc = argc + 1;
        pdVar15 = *ppdVar10;
        ppdVar10 = ppdVar10 + 1;
      } while (pdVar15 != (dropt_char *)0x0);
    }
    if (argc != 0) {
      pdVar12 = context->options;
      numElements = context->numOptions;
      if (context->sortedByLong == (option_proxy *)0x0) {
        poVar6 = (option_proxy *)dropt_safe_malloc(numElements,0x10);
        context->sortedByLong = poVar6;
        if (poVar6 != (option_proxy *)0x0) {
          ppdVar9 = &poVar6->context;
          sVar11 = numElements;
          pdVar13 = pdVar12;
          while (bVar17 = sVar11 != 0, sVar11 = sVar11 - 1, bVar17) {
            ((option_proxy *)(ppdVar9 + -1))->option = pdVar13;
            *ppdVar9 = context;
            ppdVar9 = ppdVar9 + 2;
            pdVar13 = pdVar13 + 1;
          }
          qsort(poVar6,numElements,0x10,cmp_option_proxies_long);
        }
      }
      if (context->sortedByShort == (option_proxy *)0x0) {
        poVar6 = (option_proxy *)dropt_safe_malloc(numElements,0x10);
        context->sortedByShort = poVar6;
        if (poVar6 != (option_proxy *)0x0) {
          ppdVar9 = &poVar6->context;
          sVar11 = numElements;
          while (bVar17 = sVar11 != 0, sVar11 = sVar11 - 1, bVar17) {
            ((option_proxy *)(ppdVar9 + -1))->option = pdVar12;
            *ppdVar9 = context;
            ppdVar9 = ppdVar9 + 2;
            pdVar12 = pdVar12 + 1;
          }
          qsort(poVar6,numElements,0x10,cmp_option_proxies_short);
        }
      }
      while ((((local_78.argsLeft = argc + -1, 0 < argc &&
               (__s = *local_78.argNext, __s != (char *)0x0)) && (*__s == '-')) && (__s[1] != '\0'))
            ) {
        local_78.argNext = local_78.argNext + 1;
        if (__s[1] == '-') {
          if (__s[2] == '\0') {
            return local_78.argNext;
          }
          pcVar1 = __s + 2;
          pcVar7 = strchr(pcVar1,0x3d);
          if (pcVar7 != pcVar1) {
            if (pcVar7 == (char *)0x0) {
              sVar16 = strlen(pcVar1);
              pcVar7 = pcVar1 + sVar16;
            }
            else {
              local_78.optionArgument = pcVar7 + 1;
            }
            local_48 = (long)pcVar7 - (long)pcVar1;
            local_50 = pcVar1;
            if (context->sortedByLong == (option_proxy *)0x0) {
              local_40 = context->options;
              local_38 = context;
              while (_Var3 = is_valid_option(local_40), _Var3) {
                iVar4 = cmp_key_option_proxy_long(&local_50,&local_40);
                pdVar12 = local_40;
                if (iVar4 == 0) goto LAB_00102b2a;
                local_40 = local_40 + 1;
              }
              pdVar12 = (dropt_option *)0x0;
LAB_00102b2a:
              local_78.option = pdVar12;
              if (pdVar12 != (dropt_option *)0x0) {
                dVar5 = parse_option_arg(context,&local_78);
                if (dVar5 != 0) {
                  optionName = make_char_array(__s,(long)pcVar7 - (long)__s);
                  pdVar15 = local_78.optionArgument;
                  goto LAB_00102c5a;
                }
                if (((local_78.option)->attr & 1) != 0) {
                  return local_78.argNext;
                }
                goto LAB_00102b54;
              }
            }
            else {
              puVar8 = (undefined8 *)
                       bsearch(&local_50,context->sortedByLong,context->numOptions,0x10,
                               cmp_key_option_proxy_long);
              if (puVar8 != (undefined8 *)0x0) {
                pdVar12 = (dropt_option *)*puVar8;
                goto LAB_00102b2a;
              }
              local_78.option = (dropt_option *)0x0;
            }
            sVar16 = (long)pcVar7 - (long)__s;
            goto LAB_00102c46;
          }
          sVar16 = strlen(__s);
          optionName.len = sVar16;
          optionName.s = __s;
LAB_00102c57:
          dVar5 = 4;
          pdVar15 = (dropt_char *)0x0;
LAB_00102c5a:
          set_error_details(context,dVar5,optionName,pdVar15);
          return local_78.argNext;
        }
        pcVar1 = __s + 1;
        pcVar7 = strchr(pcVar1,0x3d);
        sVar16 = (long)pcVar7 - (long)pcVar1;
        if (sVar16 == 0) {
          sVar16 = strlen(__s);
LAB_00102c46:
          optionName = make_char_array(__s,sVar16);
          goto LAB_00102c57;
        }
        if (pcVar7 == (char *)0x0) {
          sVar16 = strlen(pcVar1);
        }
        else {
          local_78.optionArgument = pcVar7 + 1;
        }
        sVar14 = 0;
        while (sVar14 != sVar16) {
          local_50 = (char *)CONCAT71(local_50._1_7_,pcVar1[sVar14]);
          if (pcVar1[sVar14] == '\0') {
            __assert_fail("shortName != DROPT_TEXT_LITERAL(\'\\0\')",
                          "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                          ,0x1ed,
                          "const dropt_option *find_option_short(const dropt_context *, dropt_char)"
                         );
          }
          if (context->ncmpstr == (dropt_strncmp_func)0x0) {
            __assert_fail("context->ncmpstr != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                          ,0x1ee,
                          "const dropt_option *find_option_short(const dropt_context *, dropt_char)"
                         );
          }
          if (context->sortedByShort != (option_proxy *)0x0) {
            puVar8 = (undefined8 *)
                     bsearch(&local_50,context->sortedByShort,context->numOptions,0x10,
                             cmp_key_option_proxy_short);
            if (puVar8 != (undefined8 *)0x0) {
              pdVar12 = (dropt_option *)*puVar8;
              goto LAB_001029fa;
            }
LAB_00102ba1:
            shortName = pcVar1[sVar14];
            dVar5 = 4;
LAB_00102bac:
            pdVar15 = (dropt_char *)0x0;
LAB_00102bae:
            set_short_option_error_details(context,dVar5,shortName,pdVar15);
            return local_78.argNext;
          }
          pdVar12 = context->options;
          while( true ) {
            _Var3 = is_valid_option(pdVar12);
            if (!_Var3) goto LAB_00102ba1;
            iVar4 = (*context->ncmpstr)((dropt_char *)&local_50,&pdVar12->short_name,1);
            if (iVar4 == 0) break;
            pdVar12 = pdVar12 + 1;
          }
LAB_001029fa:
          local_78.option = pdVar12;
          if (pdVar12 == (dropt_option *)0x0) goto LAB_00102ba1;
          sVar2 = sVar14 + 1;
          if (sVar2 != sVar16) {
            if (((context->allowConcatenatedArgs != true) || (sVar14 != 0)) ||
               (pdVar12->arg_description == (dropt_char *)0x0)) {
              if ((pdVar12->arg_description == (dropt_char *)0x0) || ((pdVar12->attr & 4) != 0)) {
                dVar5 = set_option_value(context,pdVar12,(dropt_char *)0x0);
                if (dVar5 == 0) goto LAB_00102a60;
                shortName = pcVar1[sVar14];
              }
              else {
                shortName = pcVar1[sVar14];
                dVar5 = 5;
              }
              goto LAB_00102bac;
            }
            pdVar15 = pcVar1 + sVar2;
            dVar5 = set_option_value(context,pdVar12,pdVar15);
            if ((dVar5 != 0) &&
               ((((local_78.option)->attr & 4) == 0 ||
                (dVar5 = set_option_value(context,local_78.option,(dropt_char *)0x0), dVar5 != 0))))
            {
              shortName = *pcVar1;
              goto LAB_00102bae;
            }
            break;
          }
          dVar5 = parse_option_arg(context,&local_78);
          if (dVar5 != 0) {
            shortName = pcVar1[sVar14];
            pdVar15 = local_78.optionArgument;
            goto LAB_00102bae;
          }
LAB_00102a60:
          sVar14 = sVar2;
          if (((local_78.option)->attr & 1) != 0) {
            return local_78.argNext;
          }
        }
LAB_00102b54:
        local_78.option = (dropt_option *)0x0;
        local_78.optionArgument = (char *)0x0;
        argc = local_78.argsLeft;
      }
    }
  }
  return local_78.argNext;
}

Assistant:

dropt_char**
dropt_parse(dropt_context* context,
            int argc, dropt_char** argv)
{
    dropt_char* arg;
    parse_state ps;

    ps.option = NULL;
    ps.optionArgument = NULL;
    ps.argNext = argv;

    if (argv == NULL)
    {
        /* Nothing to do. */
        goto exit;
    }

    if (context == NULL)
    {
        DROPT_MISUSE("No dropt context specified.");
        set_error_details(context, dropt_error_bad_configuration,
                          make_char_array(DROPT_TEXT_LITERAL(""), 0),
                          NULL);
        goto exit;
    }

#ifdef DROPT_NO_STRING_BUFFERS
    if (context->errorHandler == NULL)
    {
        DROPT_MISUSE("No error handler specified.");
        set_error_details(context, dropt_error_bad_configuration,
                          make_char_array(DROPT_TEXT_LITERAL(""), 0),
                          NULL);
        goto exit;
    }
#endif

    if (argc == -1)
    {
        argc = 0;
        while (argv[argc] != NULL) { argc++; }
    }

    if (argc == 0)
    {
        /* Nothing to do. */
        goto exit;
    }

    init_lookup_tables(context);

    ps.argsLeft = argc;

    while (   ps.argsLeft-- > 0
           && (arg = *ps.argNext) != NULL
           && arg[0] == DROPT_TEXT_LITERAL('-'))
    {
        if (arg[1] == DROPT_TEXT_LITERAL('\0'))
        {
            /* - */

            /* This intentionally leaves "-" unprocessed for the caller to
             * deal with.  This allows construction of programs that treat
             * "-" to mean `stdin`.
             */
            goto exit;
        }

        ps.argNext++;

        if (arg[1] == DROPT_TEXT_LITERAL('-'))
        {
            if (!parse_long_option(context, &ps, arg)) { goto exit; }
        }
        else
        {
            /* Short name. (-x) */
            if (!parse_short_option(context, &ps, arg)) { goto exit; }
        }

        ps.option = NULL;
        ps.optionArgument = NULL;
    }

exit:
    return ps.argNext;
}